

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string_type * __thiscall
nlohmann::json_abi_v3_11_3::detail::
iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
::key(iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      *this)

{
  value_t vVar1;
  pointer pbVar2;
  key_type *pkVar3;
  string_type *psVar4;
  
  pbVar2 = (this->anchor).m_object;
  if (pbVar2 == (pointer)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x1491,"GGML_ASSERT(%s) failed","anchor.m_object != nullptr");
  }
  vVar1 = (pbVar2->m_data).m_type;
  if (vVar1 != object) {
    if (vVar1 == array) {
      if (this->array_index != this->array_index_last) {
        int_to_string<std::__cxx11::string>(&this->array_index_str,this->array_index);
        this->array_index_last = this->array_index;
      }
      psVar4 = &this->array_index_str;
    }
    else {
      psVar4 = &this->empty_str;
    }
    return psVar4;
  }
  pkVar3 = iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
           ::key(&this->anchor);
  return pkVar3;
}

Assistant:

const string_type& key() const
    {
        JSON_ASSERT(anchor.m_object != nullptr);

        switch (anchor.m_object->type())
        {
            // use integer array index as key
            case value_t::array:
            {
                if (array_index != array_index_last)
                {
                    int_to_string( array_index_str, array_index );
                    array_index_last = array_index;
                }
                return array_index_str;
            }

            // use key from the object
            case value_t::object:
                return anchor.key();

            // use an empty key for all primitive types
            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
                return empty_str;
        }
    }